

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_ParseWithOpts(char *value,char **return_parse_end,int require_null_terminated)

{
  char *value_00;
  char **local_48;
  cJSON *c;
  char **ep;
  char *end;
  int require_null_terminated_local;
  char **return_parse_end_local;
  char *value_local;
  
  local_48 = return_parse_end;
  if (return_parse_end == (char **)0x0) {
    local_48 = &global_ep;
  }
  value_local = (char *)cJSON_New_Item();
  *local_48 = (char *)0x0;
  if ((cJSON *)value_local == (cJSON *)0x0) {
    value_local = (char *)0x0;
  }
  else {
    value_00 = skip(value);
    ep = (char **)parse_value((cJSON *)value_local,value_00,local_48);
    if (ep == (char **)0x0) {
      cJSON_Delete((cJSON *)value_local);
      value_local = (char *)0x0;
    }
    else if ((require_null_terminated == 0) || (ep = (char **)skip((char *)ep), *(char *)ep == '\0')
            ) {
      if (return_parse_end != (char **)0x0) {
        *return_parse_end = (char *)ep;
      }
    }
    else {
      cJSON_Delete((cJSON *)value_local);
      *local_48 = (char *)ep;
      value_local = (char *)0x0;
    }
  }
  return (cJSON *)value_local;
}

Assistant:

cJSON *cJSON_ParseWithOpts(const char *value,const char **return_parse_end,int require_null_terminated)
{
	const char *end=0,**ep=return_parse_end?return_parse_end:&global_ep;
	cJSON *c=cJSON_New_Item();
	*ep=0;
	if (!c) return 0;       /* memory fail */

	end=parse_value(c,skip(value),ep);
	if (!end)	{cJSON_Delete(c);return 0;}	/* parse failure. ep is set. */

	/* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
	if (require_null_terminated) {end=skip(end);if (*end) {cJSON_Delete(c);*ep=end;return 0;}}
	if (return_parse_end) *return_parse_end=end;
	return c;
}